

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

BOOLEAN __thiscall BVFixed::Test(BVFixed *this,BVIndex i)

{
  BVUnit *pBVar1;
  
  AssertRange(this,i);
  pBVar1 = BitsFromIndex(this,i);
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  return (pBVar1->word >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN Test(BVIndex i) const
    {
        AssertRange(i);
        return this->BitsFromIndex(i)->Test(BVUnit::Offset(i));
    }